

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O0

void __thiscall Rml::ElementEffects::ReloadEffectsData(ElementEffects *this)

{
  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
  *this_00;
  vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
  *this_01;
  bool bVar1;
  int iVar2;
  const_iterator ppvVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  const_iterator ppvVar6;
  element_type *peVar7;
  String local_138;
  CompiledFilter local_118;
  reference local_108;
  FilterEntry *filter;
  iterator __end3_1;
  iterator __begin3_1;
  FilterEntryList *__range3_1;
  FilterEntryList *list_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  FilterEntryList *local_c8;
  initializer_list<std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_*>
  local_c0;
  initializer_list<std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_*>
  *local_b0;
  initializer_list<std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_*>
  *__range2_1;
  bool filter_compile_failed;
  String local_98;
  reference local_78;
  DecoratorEntry *decorator;
  iterator __end3;
  iterator __begin3;
  DecoratorEntryList *__range3;
  DecoratorEntryList *list;
  const_iterator __end2;
  const_iterator __begin2;
  DecoratorEntryList *local_38;
  initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
  local_30;
  initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
  *local_20;
  initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
  *__range2;
  ElementEffects *pEStack_10;
  bool decorator_data_failed;
  ElementEffects *this_local;
  
  if ((this->effects_data_dirty & 1U) != 0) {
    this->effects_data_dirty = false;
    __range2._7_1_ = 0;
    __begin2 = (const_iterator)&this->decorators;
    local_38 = &this->mask_images;
    local_30._M_array = (iterator)&__begin2;
    local_30._M_len = 2;
    local_20 = &local_30;
    pEStack_10 = this;
    __end2 = ::std::
             initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
             ::begin(local_20);
    ppvVar3 = ::std::
              initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
              ::end(local_20);
    for (; __end2 != ppvVar3; __end2 = __end2 + 1) {
      this_00 = *__end2;
      __end3 = ::std::
               vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
               ::begin(this_00);
      decorator = (DecoratorEntry *)
                  ::std::
                  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                  ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Rml::ElementEffects::DecoratorEntry_*,_std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_>
                                         *)&decorator), bVar1) {
        local_78 = __gnu_cxx::
                   __normal_iterator<Rml::ElementEffects::DecoratorEntry_*,_std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_>
                   ::operator*(&__end3);
        if (local_78->decorator_data != 0) {
          peVar4 = ::std::
                   __shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_78);
          (*peVar4->_vptr_Decorator[3])(peVar4,local_78->decorator_data);
        }
        peVar4 = ::std::
                 __shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_78);
        iVar2 = (*peVar4->_vptr_Decorator[2])(peVar4,this->element,(ulong)local_78->paint_area);
        local_78->decorator_data = CONCAT44(extraout_var,iVar2);
        if (local_78->decorator_data == 0) {
          __range2._7_1_ = 1;
        }
        __gnu_cxx::
        __normal_iterator<Rml::ElementEffects::DecoratorEntry_*,_std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_>
        ::operator++(&__end3);
      }
    }
    if ((__range2._7_1_ & 1) != 0) {
      Element::GetAddress_abi_cxx11_(&local_98,this->element,false,true);
      uVar5 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"Could not generate decorator element data: %s",uVar5);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
    __range2_1._3_1_ = 0;
    __begin2_1 = (const_iterator)&this->filters;
    local_c8 = &this->backdrop_filters;
    local_c0._M_array = (iterator)&__begin2_1;
    local_c0._M_len = 2;
    local_b0 = &local_c0;
    __end2_1 = ::std::
               initializer_list<std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_*>
               ::begin(local_b0);
    ppvVar6 = ::std::
              initializer_list<std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_*>
              ::end(local_b0);
    for (; __end2_1 != ppvVar6; __end2_1 = __end2_1 + 1) {
      this_01 = *__end2_1;
      __end3_1 = ::std::
                 vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ::begin(this_01);
      filter = (FilterEntry *)
               ::std::
               vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
               ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
                                 *)&filter), bVar1) {
        local_108 = __gnu_cxx::
                    __normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
                    ::operator*(&__end3_1);
        peVar7 = ::std::
                 __shared_ptr_access<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_108);
        (*peVar7->_vptr_Filter[2])(&local_118,peVar7,this->element);
        CompiledFilter::operator=(&local_108->compiled,&local_118);
        CompiledFilter::~CompiledFilter(&local_118);
        bVar1 = UniqueRenderResource::operator_cast_to_bool
                          ((UniqueRenderResource *)&local_108->compiled);
        if (!bVar1) {
          __range2_1._3_1_ = 1;
        }
        __gnu_cxx::
        __normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
        ::operator++(&__end3_1);
      }
    }
    if ((__range2_1._3_1_ & 1) != 0) {
      Element::GetAddress_abi_cxx11_(&local_138,this->element,false,true);
      uVar5 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"Could not compile filter on element: %s",uVar5);
      ::std::__cxx11::string::~string((string *)&local_138);
    }
  }
  return;
}

Assistant:

void ElementEffects::ReloadEffectsData()
{
	if (effects_data_dirty)
	{
		effects_data_dirty = false;

		bool decorator_data_failed = false;
		for (DecoratorEntryList* list : {&decorators, &mask_images})
		{
			for (DecoratorEntry& decorator : *list)
			{
				if (decorator.decorator_data)
					decorator.decorator->ReleaseElementData(decorator.decorator_data);

				decorator.decorator_data = decorator.decorator->GenerateElementData(element, decorator.paint_area);
				if (!decorator.decorator_data)
					decorator_data_failed = true;
			}
		}

		if (decorator_data_failed)
			Log::Message(Log::LT_WARNING, "Could not generate decorator element data: %s", element->GetAddress().c_str());

		bool filter_compile_failed = false;
		for (FilterEntryList* list : {&filters, &backdrop_filters})
		{
			for (FilterEntry& filter : *list)
			{
				filter.compiled = filter.filter->CompileFilter(element);
				if (!filter.compiled)
					filter_compile_failed = true;
			}
		}

		if (filter_compile_failed)
			Log::Message(Log::LT_WARNING, "Could not compile filter on element: %s", element->GetAddress().c_str());
	}
}